

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem.c
# Opt level: O2

int mbedtls_pem_write_buffer
              (char *header,char *footer,uchar *der_data,size_t der_len,uchar *buf,size_t buf_len,
              size_t *olen)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  uchar *dst;
  uchar *__dest;
  uchar *puVar6;
  uchar *__src;
  ulong uVar7;
  ulong local_48;
  char *local_40;
  char *local_38;
  
  mbedtls_base64_encode((uchar *)0x0,0,&local_48,der_data,der_len);
  local_40 = header;
  sVar3 = strlen(header);
  local_38 = footer;
  sVar4 = strlen(footer);
  uVar7 = local_48;
  uVar5 = sVar4 + sVar3 + local_48 + (local_48 >> 6) + 1;
  if (buf_len < uVar5) {
    *olen = uVar5;
    iVar2 = -0x2a;
  }
  else {
    dst = (uchar *)calloc(1,local_48);
    if (dst == (uchar *)0x0) {
      iVar2 = -0x1180;
    }
    else {
      iVar2 = mbedtls_base64_encode(dst,uVar7,&local_48,der_data,der_len);
      pcVar1 = local_40;
      if (iVar2 == 0) {
        sVar3 = strlen(local_40);
        memcpy(buf,pcVar1,sVar3);
        sVar3 = strlen(pcVar1);
        __dest = buf + sVar3;
        __src = dst;
        for (uVar7 = local_48; pcVar1 = local_38, uVar7 != 0; uVar7 = uVar7 - sVar3) {
          sVar3 = 0x40;
          if (uVar7 < 0x40) {
            sVar3 = uVar7;
          }
          memcpy(__dest,__src,sVar3);
          __src = __src + sVar3;
          puVar6 = __dest + sVar3;
          __dest = puVar6 + 1;
          *puVar6 = '\n';
        }
        sVar3 = strlen(local_38);
        memcpy(__dest,pcVar1,sVar3);
        sVar3 = strlen(pcVar1);
        __dest[sVar3] = '\0';
        *olen = (size_t)(__dest + (sVar3 - (long)buf) + 1);
        free(dst);
        iVar2 = 0;
      }
      else {
        free(dst);
      }
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_pem_write_buffer( const char *header, const char *footer,
                      const unsigned char *der_data, size_t der_len,
                      unsigned char *buf, size_t buf_len, size_t *olen )
{
    int ret;
    unsigned char *encode_buf, *c, *p = buf;
    size_t len = 0, use_len, add_len = 0;

    mbedtls_base64_encode( NULL, 0, &use_len, der_data, der_len );
    add_len = strlen( header ) + strlen( footer ) + ( use_len / 64 ) + 1;

    if( use_len + add_len > buf_len )
    {
        *olen = use_len + add_len;
        return( MBEDTLS_ERR_BASE64_BUFFER_TOO_SMALL );
    }

    if( ( encode_buf = mbedtls_calloc( 1, use_len ) ) == NULL )
        return( MBEDTLS_ERR_PEM_ALLOC_FAILED );

    if( ( ret = mbedtls_base64_encode( encode_buf, use_len, &use_len, der_data,
                               der_len ) ) != 0 )
    {
        mbedtls_free( encode_buf );
        return( ret );
    }

    memcpy( p, header, strlen( header ) );
    p += strlen( header );
    c = encode_buf;

    while( use_len )
    {
        len = ( use_len > 64 ) ? 64 : use_len;
        memcpy( p, c, len );
        use_len -= len;
        p += len;
        c += len;
        *p++ = '\n';
    }

    memcpy( p, footer, strlen( footer ) );
    p += strlen( footer );

    *p++ = '\0';
    *olen = p - buf;

    mbedtls_free( encode_buf );
    return( 0 );
}